

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O3

void Aig_ManPackFree(Aig_ManPack_t *p)

{
  Vec_Wrd_t *pVVar1;
  word *pwVar2;
  int iVar3;
  
  printf("Patterns: ");
  printf("Total = %6d. ",(ulong)(uint)p->nPatTotal);
  printf("Skipped = %6d. ",(ulong)(uint)p->nPatSkip);
  iVar3 = Aig_ManPackCountCares(p);
  printf("Cares = %6.2f %%  ",(((double)iVar3 * 100.0) / (double)p->pAig->nObjs[2]) * 0.015625);
  putchar(10);
  pVVar1 = p->vSigns;
  pwVar2 = pVVar1->pArray;
  if (pwVar2 != (word *)0x0) {
    free(pwVar2);
  }
  free(pVVar1);
  pVVar1 = p->vPiPats;
  pwVar2 = pVVar1->pArray;
  if (pwVar2 != (word *)0x0) {
    free(pwVar2);
  }
  free(pVVar1);
  pVVar1 = p->vPiCare;
  pwVar2 = pVVar1->pArray;
  if (pwVar2 != (word *)0x0) {
    free(pwVar2);
  }
  free(pVVar1);
  free(p);
  return;
}

Assistant:

void Aig_ManPackFree( Aig_ManPack_t * p )
{
//    Aig_ManPackPrintCare( p );
    printf( "Patterns: " );
    printf( "Total = %6d. ",   p->nPatTotal );
    printf( "Skipped = %6d. ", p->nPatSkip );
    printf( "Cares = %6.2f %%  ", 100.0*Aig_ManPackCountCares(p)/Aig_ManCiNum(p->pAig)/64 );
    printf( "\n" );
    Vec_WrdFree( p->vSigns );
    Vec_WrdFree( p->vPiPats );
    Vec_WrdFree( p->vPiCare );
    ABC_FREE( p );
}